

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

void fill_flow_field_borders(double *flow,int width,int height,int stride)

{
  size_t __n;
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  int j;
  long lVar6;
  bool bVar7;
  
  uVar2 = 0;
  if (0 < height) {
    uVar2 = (ulong)(uint)height;
  }
  lVar5 = (long)stride;
  pdVar3 = flow;
  uVar4 = uVar2;
  while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
    pdVar3[-2] = *pdVar3;
    pdVar3[-1] = *pdVar3;
    pdVar3 = pdVar3 + lVar5;
  }
  pdVar3 = flow;
  for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    dVar1 = flow[uVar4 * lVar5 + (long)width + -1];
    for (lVar6 = (long)width; lVar6 < width + 2; lVar6 = lVar6 + 1) {
      pdVar3[lVar6] = dVar1;
    }
    pdVar3 = pdVar3 + lVar5;
  }
  __n = (long)width * 8 + 0x20;
  pdVar3 = flow + lVar5 * -2 + -2;
  lVar6 = 2;
  while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
    memcpy(pdVar3,flow + -2,__n);
    pdVar3 = pdVar3 + lVar5;
  }
  lVar6 = (long)height;
  pdVar3 = flow + lVar5 * lVar6 + -2;
  for (; lVar6 < height + 2; lVar6 = lVar6 + 1) {
    memcpy(pdVar3,flow + (long)((height + -1) * stride) + -2,__n);
    pdVar3 = pdVar3 + lVar5;
  }
  return;
}

Assistant:

static void fill_flow_field_borders(double *flow, int width, int height,
                                    int stride) {
  // Calculate the bounds of the rectangle which was filled in by
  // compute_flow_field() before calling this function.
  // These indices are inclusive on both ends.
  const int left_index = FLOW_BORDER_INNER;
  const int right_index = (width - FLOW_BORDER_INNER - 1);
  const int top_index = FLOW_BORDER_INNER;
  const int bottom_index = (height - FLOW_BORDER_INNER - 1);

  // Left area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double left = row[left_index];
    for (int j = -FLOW_BORDER_OUTER; j < left_index; j++) {
      row[j] = left;
    }
  }

  // Right area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double right = row[right_index];
    for (int j = right_index + 1; j < width + FLOW_BORDER_OUTER; j++) {
      row[j] = right;
    }
  }

  // Top area
  const double *top_row = flow + top_index * stride - FLOW_BORDER_OUTER;
  for (int i = -FLOW_BORDER_OUTER; i < top_index; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, top_row, length * sizeof(*row));
  }

  // Bottom area
  const double *bottom_row = flow + bottom_index * stride - FLOW_BORDER_OUTER;
  for (int i = bottom_index + 1; i < height + FLOW_BORDER_OUTER; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, bottom_row, length * sizeof(*row));
  }
}